

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_test.cpp
# Opt level: O3

void __thiscall
PermutationElement_UniformDelta_Test::TestBody(PermutationElement_UniformDelta_Test *this)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  int *args_2;
  uint uVar9;
  int n;
  int local_c8;
  int local_c4;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  ulong local_b8;
  float local_b0;
  int local_ac;
  int va;
  undefined4 uStack_a4;
  size_type local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  AssertionResult gtest_ar_;
  vector<int,_std::allocator<int>_> count;
  int vb;
  undefined4 uStack_5c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  long local_40;
  AssertHelper local_38;
  
  local_40 = 0;
  do {
    n = *(int *)((long)&DAT_00557eb0 + local_40);
    std::vector<int,_std::allocator<int>_>::vector
              (&count,(ulong)(uint)(n * n),(allocator_type *)&va);
    if (0 < n) {
      uVar9 = n * 60000;
      local_b8 = 1;
      if (1 < (int)uVar9) {
        local_b8 = (ulong)uVar9;
      }
      uVar7 = 0;
      do {
        if (0 < n) {
          uVar6 = 0;
          lVar5 = (uVar7 * 0x7fb5d329728ea185 >> 0x1b ^ uVar7 * 0x7fb5d329728ea185) *
                  -0x7e25210b43d22bb3;
          uVar8 = (uint)((ulong)lVar5 >> 0x21) ^ (uint)lVar5;
          do {
            uVar3 = n - 1U >> 1 | n - 1U;
            uVar3 = uVar3 >> 2 | uVar3;
            uVar3 = uVar3 >> 4 | uVar3;
            uVar3 = uVar3 >> 8 | uVar3;
            uVar3 = uVar3 >> 0x10 | uVar3;
            uVar2 = uVar6;
            do {
              uVar2 = (uVar2 ^ uVar8) * -0x1e8f76c3 ^ uVar8 >> 0x10;
              uVar2 = ((uVar2 & uVar3) >> 4 ^ uVar8 >> 8 ^ uVar2) * 0x929eb3f ^ uVar8 >> 0x17;
              uVar2 = ((uVar2 & uVar3) >> 1 ^ uVar2) * (uVar8 >> 0x1b | 1) * 0x6935fa69;
              uVar2 = ((uVar2 & uVar3) >> 0xb ^ uVar2) * 0x74dcb303;
              uVar2 = ((uVar2 & uVar3) >> 2 ^ uVar2) * -0x61afe33d;
              uVar2 = ((uVar2 & uVar3) >> 2 ^ uVar2) * -0x379f5c21 & uVar3;
              uVar2 = uVar2 >> 5 ^ uVar2;
            } while ((uint)n <= uVar2);
            vb = n;
            iVar4 = (uVar2 + uVar8) % (uint)n - uVar6;
            iVar4 = (iVar4 >> 0x1f & n) + iVar4;
            va = iVar4;
            if (n <= iVar4) {
              pbrt::
              LogFatal<char_const(&)[6],char_const(&)[2],char_const(&)[6],int&,char_const(&)[2],int&>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/math_test.cpp"
                         ,0x3b3,"Check failed: %s < %s with %s = %s, %s = %s",
                         (char (*) [6])0x2e2bb7f,(char (*) [2])0x55922d,(char (*) [6])0x2e2bb7f,&va,
                         (char (*) [2])0x55922d,&vb);
            }
            iVar4 = iVar4 * n + uVar6;
            uVar6 = uVar6 + 1;
            count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar4] =
                 count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                 ._M_start[iVar4] + 1;
          } while ((int)uVar6 < n);
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != local_b8);
      local_c8 = 0;
      if (0 < n) {
        local_b0 = (float)(int)uVar9 * 1.03;
        local_b8 = (ulong)(uint)((float)(int)uVar9 * 0.97);
        iVar4 = n;
        do {
          local_c4 = 0;
          if (0 < iVar4) {
            do {
              lVar5 = (long)(local_c4 * iVar4) + (long)local_c8;
              if ((float)local_b8 / (float)iVar4 <=
                  (float)count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar5]) {
                gtest_ar_.success_ =
                     (float)count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar5] <= local_b0 / (float)iVar4;
                gtest_ar_.message_.ptr_ =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                if (!gtest_ar_.success_) goto LAB_002c23b4;
              }
              else {
                gtest_ar_.success_ = false;
LAB_002c23b4:
                gtest_ar_.message_.ptr_ =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                testing::Message::Message((Message *)&local_c0);
                local_ac = (int)uVar9 / n;
                local_a0 = 0;
                local_98._M_local_buf[0] = '\0';
                args_2 = &n;
                _va = (pointer)&local_98;
                pbrt::detail::stringPrintfRecursive<int&,int&,int&,int&,int>
                          ((string *)&va,
                           "Got count %d for %d -> %d (perm size %d). Expected +/- %d.\n",
                           count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar5,&local_c8,&local_c4,args_2,
                           &local_ac);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_c0.ptr_ + 0x10),_va,local_a0);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&vb,(internal *)&gtest_ar_,
                           (AssertionResult *)
                           "count[offset] >= (1 - tol) * numIters / n && count[offset] <=(1 + tol) * numIters / n"
                           ,"false","true",(char *)args_2);
                testing::internal::AssertHelper::AssertHelper
                          (&local_38,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/math_test.cpp"
                           ,0x3be,(char *)CONCAT44(uStack_5c,vb));
                testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_c0);
                testing::internal::AssertHelper::~AssertHelper(&local_38);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(uStack_5c,vb) != &local_50) {
                  operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)CONCAT44(uStack_5c,vb),local_50._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_va != &local_98) {
                  operator_delete(_va,CONCAT71(local_98._M_allocated_capacity._1_7_,
                                               local_98._M_local_buf[0]) + 1);
                }
                if (((local_c0.ptr_ !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     ) && (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
                   (local_c0.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
                {
                  (**(code **)(*(long *)local_c0.ptr_ + 8))();
                }
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset(&gtest_ar_.message_,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              local_c4 = local_c4 + 1;
              iVar4 = n;
            } while (local_c4 < n);
          }
          local_c8 = local_c8 + 1;
        } while (local_c8 < iVar4);
      }
    }
    if (count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        != (pointer)0x0) {
      operator_delete(count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    local_40 = local_40 + 4;
    if (local_40 == 0x28) {
      return;
    }
  } while( true );
}

Assistant:

TEST(PermutationElement, UniformDelta) {
    for (int n : { 2, 3, 4, 5, 9, 14, 16, 22, 27, 36 }) {
        std::vector<int> count(n * n);

        int numIters = 60000 * n;
        for (int seed = 0; seed < numIters; ++seed) {
            for (int i = 0; i < n; ++i) {
                int ip = PermutationElement(i, n, MixBits(seed));
                int delta = ip - i;
                if (delta < 0) delta += n;
                CHECK_LT(delta, n);
                int offset = delta * n + i;
                ++count[offset];
            }
        }

        for (int i = 0; i < n; ++i) {
            for (int j = 0; j < n; ++j) {
                Float tol = 0.03f;
                int offset = j * n + i;
                EXPECT_TRUE(count[offset] >= (1 - tol) * numIters / n &&
                            count[offset] <=(1 + tol) * numIters / n) <<
                StringPrintf("Got count %d for %d -> %d (perm size %d). Expected +/- %d.\n",
                                 count[offset], i, j, n, numIters / n);
            }
        }
    }
}